

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-log.cpp
# Opt level: O3

int main(void)

{
  pointer *__ptr;
  long lVar1;
  thread threads [8];
  long *local_78;
  long local_70 [10];
  
  local_70[7] = 0;
  local_70[8] = 0;
  local_70[5] = 0;
  local_70[6] = 0;
  local_70[3] = 0;
  local_70[4] = 0;
  local_70[1] = 0;
  local_70[2] = 0;
  lVar1 = 0;
  do {
    local_70[0] = 0;
    local_78 = (long *)operator_new(0x10);
    *local_78 = (long)&PTR___State_00106ca0;
    *(int *)(local_78 + 1) = (int)lVar1;
    std::thread::_M_start_thread(local_70,&local_78,0);
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
    if (local_70[lVar1 + 1] != 0) goto LAB_00102517;
    local_70[lVar1 + 1] = local_70[0];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  lVar1 = 0;
  do {
    std::thread::join();
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x40);
  lVar1 = 0x40;
  while (*(long *)((long)local_70 + lVar1) == 0) {
    lVar1 = lVar1 + -8;
    if (lVar1 == 0) {
      return 0;
    }
  }
LAB_00102517:
  std::terminate();
}

Assistant:

int main() {
    const int n_thread = 8;

    std::thread threads[n_thread];
    for (int i = 0; i < n_thread; i++) {
        threads[i] = std::thread([i]() {
            const int n_msg = 1000;

            for (int j = 0; j < n_msg; j++) {
                const int log_type = std::rand() % 4;

                switch (log_type) {
                    case 0: LOG_INF("Thread %d: %d\n", i, j); break;
                    case 1: LOG_WRN("Thread %d: %d\n", i, j); break;
                    case 2: LOG_ERR("Thread %d: %d\n", i, j); break;
                    case 3: LOG_DBG("Thread %d: %d\n", i, j); break;
                    default:
                        break;
                }

                if (rand () % 10 < 5) {
                    common_log_set_timestamps(common_log_main(), rand() % 2);
                    common_log_set_prefix    (common_log_main(), rand() % 2);
                }
            }
        });
    }

    for (int i = 0; i < n_thread; i++) {
        threads[i].join();
    }

    return 0;
}